

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_AddDelete_FieldOrderingTest_Test::TestBody
          (ComparisonTest_AddDelete_FieldOrderingTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ComparisonTest_AddDelete_FieldOrderingTest_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  proto2_unittest::TestFieldOrderings::
  ClearExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false>
            (&(this->super_ComparisonTest).orderings_proto1_,
             (ExtensionIdentifier<proto2_unittest::TestFieldOrderings,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
              *)proto2_unittest::my_extension_string);
  proto2_unittest::TestFieldOrderings::clear_my_int(&(this->super_ComparisonTest).orderings_proto2_)
  ;
  protobuf::(anonymous_namespace)::ComparisonTest::RunOrder_abi_cxx11_(&local_40,this);
  testing::internal::EqHelper::
  Compare<char[72],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_20,
             "\"deleted: my_int: 1\\n\" \"added: (proto2_unittest.my_extension_string): \\\"bar\\\"\\n\""
             ,"RunOrder()",
             (char (*) [72])
             "deleted: my_int: 1\nadded: (proto2_unittest.my_extension_string): \"bar\"\n",&local_40
            );
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xdc3,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(ComparisonTest, AddDelete_FieldOrderingTest) {
  orderings_proto1_.ClearExtension(unittest::my_extension_string);
  orderings_proto2_.clear_my_int();

  EXPECT_EQ(
      "deleted: my_int: 1\n"
      "added: (proto2_unittest.my_extension_string): \"bar\"\n",
      RunOrder());
}